

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3InsertDocsize(int *pRC,Fts3Table *p,u32 *aSz)

{
  int iVar1;
  char *zBuf;
  int nBlob;
  sqlite3_stmt *pStmt;
  
  if (*pRC != 0) {
    return;
  }
  zBuf = (char *)sqlite3_malloc(p->nColumn * 10);
  if (zBuf == (char *)0x0) {
    iVar1 = 7;
  }
  else {
    fts3EncodeIntArray(p->nColumn,aSz,zBuf,&nBlob);
    iVar1 = fts3SqlStmt(p,0x14,&pStmt,(sqlite3_value **)0x0);
    if (iVar1 == 0) {
      sqlite3_bind_int64(pStmt,1,p->iPrevDocid);
      sqlite3_bind_blob(pStmt,2,zBuf,nBlob,sqlite3_free);
      sqlite3_step(pStmt);
      iVar1 = sqlite3_reset(pStmt);
    }
    else {
      sqlite3_free(zBuf);
    }
  }
  *pRC = iVar1;
  return;
}

Assistant:

static void fts3InsertDocsize(
  int *pRC,                       /* Result code */
  Fts3Table *p,                   /* Table into which to insert */
  u32 *aSz                        /* Sizes of each column, in tokens */
){
  char *pBlob;             /* The BLOB encoding of the document size */
  int nBlob;               /* Number of bytes in the BLOB */
  sqlite3_stmt *pStmt;     /* Statement used to insert the encoding */
  int rc;                  /* Result code from subfunctions */

  if( *pRC ) return;
  pBlob = sqlite3_malloc( 10*p->nColumn );
  if( pBlob==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  fts3EncodeIntArray(p->nColumn, aSz, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_DOCSIZE, &pStmt, 0);
  if( rc ){
    sqlite3_free(pBlob);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int64(pStmt, 1, p->iPrevDocid);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, sqlite3_free);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
}